

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall
wasm_module_t::wasm_module_t
          (wasm_module_t *this,RefPtr<wabt::interp::Module> *ptr,wasm_byte_vec_t *in)

{
  Module *pMVar1;
  Store *this_00;
  Index index;
  Index IVar2;
  
  pMVar1 = ptr->obj_;
  this_00 = ptr->store_;
  if (this_00 == (Store *)0x0) {
    (this->super_wasm_ref_t).I.obj_ = &pMVar1->super_Object;
    (this->super_wasm_ref_t).I.store_ = (Store *)0x0;
    index = 0;
    IVar2 = 0;
  }
  else {
    index = wabt::interp::Store::CopyRoot(this_00,ptr->root_index_);
    (this->super_wasm_ref_t).I.obj_ = &pMVar1->super_Object;
    (this->super_wasm_ref_t).I.store_ = this_00;
    IVar2 = wabt::interp::Store::CopyRoot(this_00,index);
  }
  (this->super_wasm_ref_t).I.root_index_ = IVar2;
  if (pMVar1 != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot(this_00,index);
  }
  wasm_byte_vec_copy(&this->binary,in);
  return;
}

Assistant:

wasm_module_t(RefPtr<Module> ptr, const wasm_byte_vec_t* in)
      : wasm_ref_t(ptr) {
    wasm_byte_vec_copy(&binary, in);
  }